

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHashedSimplePairCache.cpp
# Opt level: O0

void * __thiscall
btHashedSimplePairCache::removeOverlappingPair(btHashedSimplePairCache *this,int indexA,int indexB)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  btSimplePair *pbVar5;
  btSimplePair *pbVar6;
  int *piVar7;
  uint in_EDX;
  uint in_ESI;
  btHashedSimplePairCache *in_RDI;
  int lastHash;
  btSimplePair *last;
  int lastPairIndex;
  int previous;
  int index;
  int pairIndex;
  void *userData;
  btSimplePair *pair;
  int hash;
  int in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int local_3c;
  int local_38;
  void *local_8;
  
  gRemoveSimplePairs = gRemoveSimplePairs + 1;
  uVar1 = getHash(in_RDI,in_ESI,in_EDX);
  iVar2 = btAlignedObjectArray<btSimplePair>::capacity(&in_RDI->m_overlappingPairArray);
  uVar1 = uVar1 & iVar2 - 1U;
  pbVar5 = internalFindPair((btHashedSimplePairCache *)
                            CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                            in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,
                            in_stack_ffffffffffffff8c);
  if (pbVar5 == (btSimplePair *)0x0) {
    local_8 = (void *)0x0;
  }
  else {
    local_8 = (pbVar5->field_2).m_userPointer;
    pbVar6 = btAlignedObjectArray<btSimplePair>::operator[](&in_RDI->m_overlappingPairArray,0);
    iVar2 = (int)((long)pbVar5 - (long)pbVar6 >> 4);
    piVar7 = btAlignedObjectArray<int>::operator[](&in_RDI->m_hashTable,uVar1);
    local_38 = *piVar7;
    local_3c = -1;
    while (local_38 != iVar2) {
      local_3c = local_38;
      piVar7 = btAlignedObjectArray<int>::operator[](&in_RDI->m_next,local_38);
      local_38 = *piVar7;
    }
    if (local_3c == -1) {
      piVar7 = btAlignedObjectArray<int>::operator[](&in_RDI->m_next,iVar2);
      iVar3 = *piVar7;
      piVar7 = btAlignedObjectArray<int>::operator[](&in_RDI->m_hashTable,uVar1);
      *piVar7 = iVar3;
    }
    else {
      piVar7 = btAlignedObjectArray<int>::operator[](&in_RDI->m_next,iVar2);
      iVar3 = *piVar7;
      piVar7 = btAlignedObjectArray<int>::operator[](&in_RDI->m_next,local_3c);
      *piVar7 = iVar3;
    }
    iVar3 = btAlignedObjectArray<btSimplePair>::size(&in_RDI->m_overlappingPairArray);
    iVar3 = iVar3 + -1;
    if (iVar3 == iVar2) {
      btAlignedObjectArray<btSimplePair>::pop_back(&in_RDI->m_overlappingPairArray);
    }
    else {
      pbVar5 = btAlignedObjectArray<btSimplePair>::operator[](&in_RDI->m_overlappingPairArray,iVar3)
      ;
      uVar1 = getHash(in_RDI,pbVar5->m_indexA,pbVar5->m_indexB);
      iVar4 = btAlignedObjectArray<btSimplePair>::capacity(&in_RDI->m_overlappingPairArray);
      uVar1 = uVar1 & iVar4 - 1U;
      piVar7 = btAlignedObjectArray<int>::operator[](&in_RDI->m_hashTable,uVar1);
      local_38 = *piVar7;
      local_3c = -1;
      while (local_38 != iVar3) {
        local_3c = local_38;
        piVar7 = btAlignedObjectArray<int>::operator[](&in_RDI->m_next,local_38);
        local_38 = *piVar7;
      }
      if (local_3c == -1) {
        piVar7 = btAlignedObjectArray<int>::operator[](&in_RDI->m_next,iVar3);
        iVar4 = *piVar7;
        piVar7 = btAlignedObjectArray<int>::operator[](&in_RDI->m_hashTable,uVar1);
        *piVar7 = iVar4;
      }
      else {
        piVar7 = btAlignedObjectArray<int>::operator[](&in_RDI->m_next,iVar3);
        iVar4 = *piVar7;
        piVar7 = btAlignedObjectArray<int>::operator[](&in_RDI->m_next,local_3c);
        *piVar7 = iVar4;
      }
      pbVar5 = btAlignedObjectArray<btSimplePair>::operator[](&in_RDI->m_overlappingPairArray,iVar3)
      ;
      pbVar6 = btAlignedObjectArray<btSimplePair>::operator[](&in_RDI->m_overlappingPairArray,iVar2)
      ;
      iVar3 = pbVar5->m_indexB;
      pbVar6->m_indexA = pbVar5->m_indexA;
      pbVar6->m_indexB = iVar3;
      pbVar6->field_2 = pbVar5->field_2;
      piVar7 = btAlignedObjectArray<int>::operator[](&in_RDI->m_hashTable,uVar1);
      iVar3 = *piVar7;
      piVar7 = btAlignedObjectArray<int>::operator[](&in_RDI->m_next,iVar2);
      *piVar7 = iVar3;
      piVar7 = btAlignedObjectArray<int>::operator[](&in_RDI->m_hashTable,uVar1);
      *piVar7 = iVar2;
      btAlignedObjectArray<btSimplePair>::pop_back(&in_RDI->m_overlappingPairArray);
    }
  }
  return local_8;
}

Assistant:

void* btHashedSimplePairCache::removeOverlappingPair(int indexA, int indexB)
{
	gRemoveSimplePairs++;
	

	/*if (indexA > indexB) 
		btSwap(indexA, indexB);*/

	int	hash = static_cast<int>(getHash(static_cast<unsigned int>(indexA),static_cast<unsigned int>(indexB)) & (m_overlappingPairArray.capacity()-1));

	btSimplePair* pair = internalFindPair(indexA, indexB, hash);
	if (pair == NULL)
	{
		return 0;
	}

	
	void* userData = pair->m_userPointer;


	int pairIndex = int(pair - &m_overlappingPairArray[0]);
	btAssert(pairIndex < m_overlappingPairArray.size());

	// Remove the pair from the hash table.
	int index = m_hashTable[hash];
	btAssert(index != BT_SIMPLE_NULL_PAIR);

	int previous = BT_SIMPLE_NULL_PAIR;
	while (index != pairIndex)
	{
		previous = index;
		index = m_next[index];
	}

	if (previous != BT_SIMPLE_NULL_PAIR)
	{
		btAssert(m_next[previous] == pairIndex);
		m_next[previous] = m_next[pairIndex];
	}
	else
	{
		m_hashTable[hash] = m_next[pairIndex];
	}

	// We now move the last pair into spot of the
	// pair being removed. We need to fix the hash
	// table indices to support the move.

	int lastPairIndex = m_overlappingPairArray.size() - 1;

	// If the removed pair is the last pair, we are done.
	if (lastPairIndex == pairIndex)
	{
		m_overlappingPairArray.pop_back();
		return userData;
	}

	// Remove the last pair from the hash table.
	const btSimplePair* last = &m_overlappingPairArray[lastPairIndex];
		/* missing swap here too, Nat. */ 
	int lastHash = static_cast<int>(getHash(static_cast<unsigned int>(last->m_indexA), static_cast<unsigned int>(last->m_indexB)) & (m_overlappingPairArray.capacity()-1));

	index = m_hashTable[lastHash];
	btAssert(index != BT_SIMPLE_NULL_PAIR);

	previous = BT_SIMPLE_NULL_PAIR;
	while (index != lastPairIndex)
	{
		previous = index;
		index = m_next[index];
	}

	if (previous != BT_SIMPLE_NULL_PAIR)
	{
		btAssert(m_next[previous] == lastPairIndex);
		m_next[previous] = m_next[lastPairIndex];
	}
	else
	{
		m_hashTable[lastHash] = m_next[lastPairIndex];
	}

	// Copy the last pair into the remove pair's spot.
	m_overlappingPairArray[pairIndex] = m_overlappingPairArray[lastPairIndex];

	// Insert the last pair into the hash table
	m_next[pairIndex] = m_hashTable[lastHash];
	m_hashTable[lastHash] = pairIndex;

	m_overlappingPairArray.pop_back();

	return userData;
}